

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# explorer.hpp
# Opt level: O2

void explorer::DumpToFile<uttt::IBoard,uttt::IBoardWriter>
               (string *filename,vector<uttt::IBoard,_std::allocator<uttt::IBoard>_> *data)

{
  int i;
  uint uVar1;
  long lVar2;
  ostream *poVar3;
  long lVar4;
  long lVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  vector<char,_std::allocator<char>_> bytes;
  char count_buf [8];
  ofstream file;
  
  lVar2 = ((long)(data->super__Vector_base<uttt::IBoard,_std::allocator<uttt::IBoard>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)(data->super__Vector_base<uttt::IBoard,_std::allocator<uttt::IBoard>_>)._M_impl.
                super__Vector_impl_data._M_start) / 0x18;
  lVar5 = lVar2;
  for (uVar1 = 7; -1 < (int)uVar1; uVar1 = uVar1 - 1) {
    count_buf[uVar1] = (char)lVar5;
    lVar5 = lVar5 >> 8;
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"Serializing ");
  poVar3 = std::ostream::_M_insert<long_long>((longlong)poVar3);
  std::operator<<(poVar3," nodes...\n");
  lVar5 = std::chrono::_V2::system_clock::now();
  uttt::IBoardWriter::operator()(&bytes,(IBoardWriter *)&file,data);
  lVar4 = std::chrono::_V2::system_clock::now();
  poVar3 = std::operator<<((ostream *)&std::cout,"Serialization done: ");
  poVar3 = std::ostream::_M_insert<long_long>((longlong)poVar3);
  poVar3 = std::operator<<(poVar3," nodes in ");
  poVar3 = std::ostream::_M_insert<long>((long)poVar3);
  poVar3 = std::operator<<(poVar3,"s ");
  poVar3 = std::ostream::_M_insert<long>((long)poVar3);
  std::operator<<(poVar3,"ms, ");
  dVar6 = (double)((lVar4 - lVar5) / 1000000);
  poVar3 = std::ostream::_M_insert<double>(((double)lVar2 * 1000.0) / dVar6);
  std::operator<<(poVar3," nps, ");
  lVar5 = (long)bytes.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)bytes.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start;
  auVar7._8_4_ = (int)((ulong)lVar5 >> 0x20);
  auVar7._0_8_ = lVar5;
  auVar7._12_4_ = 0x45300000;
  poVar3 = std::ostream::_M_insert<double>
                     ((((auVar7._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)) *
                       0.0009765625 * 1000.0 * 0.0009765625) / dVar6);
  std::operator<<(poVar3," MB/s\n");
  poVar3 = std::operator<<((ostream *)&std::cout,"Writing ");
  poVar3 = std::ostream::_M_insert<long_long>((longlong)poVar3);
  poVar3 = std::operator<<(poVar3," nodes to ");
  poVar3 = std::operator<<(poVar3,(string *)filename);
  std::operator<<(poVar3,'\n');
  lVar5 = std::chrono::_V2::system_clock::now();
  std::ofstream::ofstream(&file,(string *)filename,_S_bin);
  std::ostream::write((char *)&file,(long)count_buf);
  std::ostream::write((char *)&file,
                      (long)bytes.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
  lVar2 = std::chrono::_V2::system_clock::now();
  poVar3 = std::operator<<((ostream *)&std::cout,"Writing done: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3," bytes in ");
  poVar3 = std::ostream::_M_insert<long>((long)poVar3);
  poVar3 = std::operator<<(poVar3,"s ");
  poVar3 = std::ostream::_M_insert<long>((long)poVar3);
  std::operator<<(poVar3,"ms, ");
  lVar4 = (long)bytes.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)bytes.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start;
  auVar8._8_4_ = (int)((ulong)lVar4 >> 0x20);
  auVar8._0_8_ = lVar4;
  auVar8._12_4_ = 0x45300000;
  poVar3 = std::ostream::_M_insert<double>
                     ((((auVar8._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0)) *
                       0.0009765625 * 1000.0 * 0.0009765625) / (double)((lVar2 - lVar5) / 1000000));
  std::operator<<(poVar3," MB/s\n");
  std::ofstream::~ofstream(&file);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&bytes.super__Vector_base<char,_std::allocator<char>_>);
  return;
}

Assistant:

static void
DumpToFile(const std::string &filename, const std::vector<IGame> &data)
{
    long long count = data.size();

    char count_buf[8];
    for (int i = 7; i >= 0; --i)
    {
        count_buf[i] = count & 0xff;
        count >>= 8;
    }

    count = data.size();

    std::cout << "Serializing " << count << " nodes...\n";
    auto t1 = std::chrono::high_resolution_clock::now();
    auto bytes = Writer()(data);
    auto t2 = std::chrono::high_resolution_clock::now();
    auto millis = std::chrono::duration_cast<std::chrono::milliseconds>(t2 - t1).count();
    std::cout << "Serialization done: " << count << " nodes in " << millis / 1000 << "s " << millis % 1000 << "ms, " << double(count) * 1000 / millis << " nps, " << double(bytes.size()) / 1024 * 1000 / 1024 / millis << " MB/s\n";

    std::cout << "Writing " << count << " nodes to " << filename << '\n';
    t1 = std::chrono::high_resolution_clock::now();
    std::ofstream file(filename, std::ios::binary);
    file.write(count_buf, 8);
    file.write(&bytes[0], bytes.size());
    t2 = std::chrono::high_resolution_clock::now();
    millis = std::chrono::duration_cast<std::chrono::milliseconds>(t2 - t1).count();
    std::cout << "Writing done: " << bytes.size() << " bytes in " << millis / 1000 << "s " << millis % 1000 << "ms, " << double(bytes.size()) / 1024 * 1000 / 1024 / millis << " MB/s\n";
}